

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O2

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CBinopExpression *expression)

{
  undefined8 this_00;
  _Head_base<0UL,_const_IRT::CExpressionList_*,_false> _Var1;
  TOperationType TVar2;
  CExpression *pCVar3;
  CEseqExpression *pCVar4;
  long lVar5;
  CBinopExpression *pCVar6;
  CStatement *pCVar7;
  INode IVar8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> rightEseq;
  pointer_____offset_0x10___ *binop;
  CBinopExpression *pCVar9;
  undefined1 local_90 [24];
  _Head_base<0UL,_const_IRT::CExpressionList_*,_false> local_78;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_70;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_68;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_60;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_58;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_50;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_48;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_40;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_38;
  
  pCVar3 = CBinopExpression::getLeftOperand(expression);
  (**(pCVar3->super_IExpression).super_INode._vptr_INode)(pCVar3,this);
  rightEseq._M_head_impl =
       (this->childExpression)._M_t.
       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  pCVar3 = CBinopExpression::getRightOperand(expression);
  binop = (pointer_____offset_0x10___ *)this;
  (**(pCVar3->super_IExpression).super_INode._vptr_INode)(pCVar3);
  pCVar9 = (CBinopExpression *)
           (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  if ((CEseqExpression *)rightEseq._M_head_impl == (CEseqExpression *)0x0) {
    pCVar4 = (CEseqExpression *)0x0;
  }
  else {
    binop = &CExpression::typeinfo;
    pCVar4 = (CEseqExpression *)
             __dynamic_cast(rightEseq._M_head_impl,&CExpression::typeinfo,&CEseqExpression::typeinfo
                            ,0);
  }
  if (pCVar9 == (CBinopExpression *)0x0) {
    lVar5 = 0;
  }
  else {
    binop = &CExpression::typeinfo;
    lVar5 = __dynamic_cast(pCVar9,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  if (pCVar4 == (CEseqExpression *)0x0 && lVar5 == 0) {
    pCVar6 = (CBinopExpression *)operator_new(0x20);
    local_50._M_head_impl = (CExpression *)pCVar9;
    local_38._M_head_impl = rightEseq._M_head_impl;
    TVar2 = CBinopExpression::getOperation(expression);
    CBinopExpression::CBinopExpression
              (pCVar6,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_38,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_50,TVar2);
    pCVar3 = (this->childExpression)._M_t.
             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    (this->childExpression)._M_t.
    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t
    .super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)pCVar6;
    if (pCVar3 != (CExpression *)0x0) {
      (**(code **)((long)(pCVar3->super_IExpression).super_INode + 0x10))();
    }
    if ((CBinopExpression *)local_50._M_head_impl != (CBinopExpression *)0x0) {
      (*(((CExpression *)&(local_50._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_50._M_head_impl = (CExpression *)0x0;
    rightEseq._M_head_impl = local_38._M_head_impl;
    goto LAB_0012f2db;
  }
  if ((pCVar4 == (CEseqExpression *)0x0) && (lVar5 != 0)) {
    processRightEseqInCBinop
              ((CEseqFloatVisitor *)local_90,(CBinopExpression *)binop,
               &expression->super_CExpression,(CEseqExpression *)rightEseq._M_head_impl);
    pCVar6 = (CBinopExpression *)
             (this->childExpression)._M_t.
             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    (this->childExpression)._M_t.
    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t
    .super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
         (CExpression *)local_90._0_8_;
LAB_0012f178:
    if (pCVar6 != (CBinopExpression *)0x0) {
      (*(pCVar6->super_CExpression).super_IExpression.super_INode._vptr_INode[2])();
    }
LAB_0012f183:
    if (pCVar9 == (CBinopExpression *)0x0) goto LAB_0012f2db;
    IVar8._vptr_INode = *(_func_int ***)&(pCVar9->super_CExpression).super_IExpression;
  }
  else {
    if ((pCVar4 == (CEseqExpression *)0x0) || (lVar5 != 0)) {
      if ((pCVar4 != (CEseqExpression *)0x0) && (lVar5 != 0)) {
        local_78._M_head_impl = (CExpressionList *)operator_new(0x18);
        pCVar6 = (CBinopExpression *)CEseqExpression::getStatement(pCVar4);
        (*(pCVar6->super_CExpression).super_IExpression.super_INode._vptr_INode[3])(local_90);
        local_90._8_8_ = local_90._0_8_;
        local_70._M_head_impl = (CExpression *)local_90._0_8_;
        local_90._0_8_ = (CBinopExpression *)0x0;
        pCVar4 = (CEseqExpression *)CEseqExpression::getExpression(pCVar4);
        processRightEseqInCBinop
                  ((CEseqFloatVisitor *)(local_90 + 0x10),pCVar6,&expression->super_CExpression,
                   pCVar4);
        _Var1._M_head_impl = local_78._M_head_impl;
        local_48._M_head_impl = (CExpression *)local_90._16_8_;
        CEseqExpression::CEseqExpression
                  ((CEseqExpression *)local_78._M_head_impl,
                   (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *
                   )&local_70,
                   (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                    *)&local_48);
        pCVar3 = (this->childExpression)._M_t.
                 super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                 .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
        (this->childExpression)._M_t.
        super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
        _M_t.
        super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
        .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
             (CExpression *)_Var1._M_head_impl;
        if (pCVar3 != (CExpression *)0x0) {
          (**(code **)((long)(pCVar3->super_IExpression).super_INode + 0x10))();
        }
        if (local_48._M_head_impl != (CExpression *)0x0) {
          (*((local_48._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
        }
        local_48._M_head_impl = (CExpression *)0x0;
        if ((CBinopExpression *)local_70._M_head_impl != (CBinopExpression *)0x0) {
          (*(((CExpression *)&(local_70._M_head_impl)->super_IExpression)->super_IExpression).
            super_INode._vptr_INode[2])();
        }
        local_70._M_head_impl = (CExpression *)0x0;
        pCVar6 = (CBinopExpression *)local_90._0_8_;
        goto LAB_0012f178;
      }
      goto LAB_0012f183;
    }
    local_78._M_head_impl = (CExpressionList *)operator_new(0x18);
    pCVar7 = CEseqExpression::getStatement(pCVar4);
    (*(pCVar7->super_IStatement).super_INode._vptr_INode[3])(local_90,pCVar7);
    local_58._M_head_impl = (CExpression *)local_90._0_8_;
    local_90._0_8_ = (CBinopExpression *)0x0;
    local_90._8_8_ = operator_new(0x20);
    pCVar3 = CEseqExpression::getExpression(pCVar4);
    (*(pCVar3->super_IExpression).super_INode._vptr_INode[3])(local_90 + 0x10,pCVar3);
    this_00 = local_90._8_8_;
    local_60._M_head_impl = (CExpression *)local_90._16_8_;
    local_90._16_8_ =
         (__uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>)0x0;
    local_68._M_head_impl = (CExpression *)pCVar9;
    TVar2 = CBinopExpression::getOperation(expression);
    CBinopExpression::CBinopExpression
              ((CBinopExpression *)this_00,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_60,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_68,TVar2);
    _Var1._M_head_impl = local_78._M_head_impl;
    local_40._M_head_impl = (CExpression *)this_00;
    CEseqExpression::CEseqExpression
              ((CEseqExpression *)local_78._M_head_impl,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_58,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_40);
    pCVar3 = (this->childExpression)._M_t.
             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    (this->childExpression)._M_t.
    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t
    .super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
         (CExpression *)_Var1._M_head_impl;
    if (pCVar3 != (CExpression *)0x0) {
      (**(code **)((long)(pCVar3->super_IExpression).super_INode + 0x10))();
    }
    if ((CBinopExpression *)local_40._M_head_impl != (CBinopExpression *)0x0) {
      (*(((CExpression *)&(local_40._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_40._M_head_impl = (CExpression *)0x0;
    if ((CBinopExpression *)local_68._M_head_impl != (CBinopExpression *)0x0) {
      (*(((CExpression *)&(local_68._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_68._M_head_impl = (CExpression *)0x0;
    if (local_60._M_head_impl != (CExpression *)0x0) {
      (*((local_60._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_60._M_head_impl = (CExpression *)0x0;
    if ((_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
        local_90._16_8_ != (CExpression *)0x0) {
      (**(code **)((long)*(IExpression *)local_90._16_8_ + 0x10))();
    }
    if ((CBinopExpression *)local_58._M_head_impl != (CBinopExpression *)0x0) {
      (*(((CExpression *)&(local_58._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_58._M_head_impl = (CExpression *)0x0;
    if ((CBinopExpression *)local_90._0_8_ == (CBinopExpression *)0x0) goto LAB_0012f2db;
    IVar8._vptr_INode = *(_func_int ***)local_90._0_8_;
    pCVar9 = (CBinopExpression *)local_90._0_8_;
  }
  (**(code **)((long)IVar8._vptr_INode + 0x10))(pCVar9);
LAB_0012f2db:
  if ((CEseqExpression *)rightEseq._M_head_impl != (CEseqExpression *)0x0) {
    (*(((CEseqExpression *)rightEseq._M_head_impl)->super_CExpression).super_IExpression.super_INode
      ._vptr_INode[2])(rightEseq._M_head_impl);
  }
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CBinopExpression &expression) {
    expression.getLeftOperand()->Accept(*this);
    std::unique_ptr<const CExpression> left = std::move(childExpression);

    expression.getRightOperand()->Accept(*this);
    std::unique_ptr<const CExpression> right = std::move(childExpression);

    const CEseqExpression* leftEseq = dynamic_cast<const CEseqExpression*>(left.get());
    const CEseqExpression* rightEseq = dynamic_cast<const CEseqExpression*>(right.get());

    if (leftEseq == nullptr && rightEseq == nullptr) {
        childExpression = EMOVE_UNIQ(new CBinopExpression(
                std::move(left),
                std::move(right),
                expression.getOperation()
        ));

        return;
    }

    if (leftEseq == nullptr && rightEseq != nullptr) {
        childExpression = std::move(processRightEseqInCBinop(&expression, left.get(), rightEseq));

        return;
    }

    if (leftEseq != nullptr && rightEseq == nullptr) {
        childExpression = EMOVE_UNIQ(new CEseqExpression(
                std::move(leftEseq->getStatement()->Copy()),
                EMOVE_UNIQ(new CBinopExpression(
                        std::move(leftEseq->getExpression()->Copy()),
                        std::move(right),
                        expression.getOperation()
                ))
        ));


        return;
    }

    if (leftEseq != nullptr && rightEseq != nullptr) {
        childExpression = EMOVE_UNIQ(new CEseqExpression(
                std::move(leftEseq->getStatement()->Copy()),
                std::move(processRightEseqInCBinop(&expression, leftEseq->getExpression(), rightEseq))
        ));

        return;
    }
}